

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestCaseInfo::swap(TestCaseInfo *this,TestCaseInfo *other)

{
  ITestCase *pIVar1;
  
  pIVar1 = (this->m_test).m_p;
  (this->m_test).m_p = (other->m_test).m_p;
  (other->m_test).m_p = pIVar1;
  std::__cxx11::string::swap((string *)&this->m_className);
  std::__cxx11::string::swap((string *)&this->m_name);
  std::__cxx11::string::swap((string *)&this->m_description);
  std::swap<Catch::SourceLineInfo>(&this->m_lineInfo,&other->m_lineInfo);
  return;
}

Assistant:

void TestCaseInfo::swap( TestCaseInfo& other ) {
        m_test.swap( other.m_test );
        m_className.swap( other.m_className );
        m_name.swap( other.m_name );
        m_description.swap( other.m_description );
        std::swap( m_lineInfo, other.m_lineInfo );
    }